

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ruby_generator.cc
# Opt level: O2

int google::protobuf::compiler::ruby::GeneratePackageModules(FileDescriptor *file,Printer *printer)

{
  bool bVar1;
  long lVar2;
  LogMessage *this;
  char needle;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  int iVar4;
  char *__s;
  string_view haystack;
  string_view text;
  string_view needle_00;
  string_view name;
  string_view haystack_00;
  string package_name;
  string component;
  string delimiter;
  string local_50;
  
  package_name._M_dataplus._M_p = (pointer)&package_name.field_2;
  package_name._M_string_length = 0;
  package_name.field_2._M_local_buf[0] = '\0';
  if ((*(byte *)((long)&file->options_->field_0 + 0x19) & 2) == 0) {
    component._M_string_length = (size_type)(file->package_->_M_dataplus)._M_p;
    component._M_dataplus._M_p = (pointer)file->package_->_M_string_length;
    std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
              ((string *)&delimiter,(basic_string_view<char,_std::char_traits<char>_> *)&component,
               (allocator<char> *)&local_50);
    std::__cxx11::string::operator=((string *)&package_name,(string *)&delimiter);
    std::__cxx11::string::~string((string *)&delimiter);
  }
  else {
    std::__cxx11::string::_M_assign((string *)&package_name);
    __s = "::";
    needle_00._M_str = "::";
    needle_00._M_len = 2;
    needle = -0x71;
    haystack_00._M_str = package_name._M_dataplus._M_p;
    haystack_00._M_len = package_name._M_string_length;
    bVar1 = absl::lts_20250127::StrContains(haystack_00,needle_00);
    if (bVar1) {
      bVar1 = false;
      goto LAB_001a9fdf;
    }
    haystack._M_str = (char *)0x2e;
    haystack._M_len = (size_t)package_name._M_dataplus._M_p;
    bVar1 = absl::lts_20250127::StrContains
                      ((lts_20250127 *)package_name._M_string_length,haystack,needle);
    if (bVar1) {
      absl::lts_20250127::log_internal::LogMessage::LogMessage
                ((LogMessage *)&delimiter,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/ruby/ruby_generator.cc"
                 ,0xac);
      this = absl::lts_20250127::log_internal::LogMessage::operator<<
                       ((LogMessage *)&delimiter,
                        (char (*) [46])"ruby_package option should be in the form of:");
      absl::lts_20250127::log_internal::LogMessage::operator<<
                (this,(char (*) [27])" \'A::B::C\' and not \'A.B.C\'");
      absl::lts_20250127::log_internal::LogMessage::~LogMessage((LogMessage *)&delimiter);
    }
  }
  __s = ".";
  bVar1 = true;
LAB_001a9fdf:
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&delimiter,__s,(allocator<char> *)&component);
  iVar4 = 0;
  while (package_name._M_string_length != 0) {
    lVar2 = std::__cxx11::string::find((string *)&package_name,(ulong)&delimiter);
    paVar3 = &component.field_2;
    component._M_string_length = 0;
    component.field_2._M_local_buf[0] = '\0';
    component._M_dataplus._M_p = (pointer)paVar3;
    if (lVar2 == -1) {
      std::__cxx11::string::_M_assign((string *)&component);
      std::__cxx11::string::assign((char *)&package_name);
    }
    else {
      std::__cxx11::string::substr((ulong)&local_50,(ulong)&package_name);
      std::__cxx11::string::operator=((string *)&component,(string *)&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      paVar3 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)0xffffffffffffffff;
      std::__cxx11::string::substr((ulong)&local_50,(ulong)&package_name);
      std::__cxx11::string::operator=((string *)&package_name,(string *)&local_50);
      std::__cxx11::string::~string((string *)&local_50);
    }
    if (bVar1) {
      name._M_str = (char *)paVar3;
      name._M_len = (size_t)component._M_dataplus._M_p;
      PackageToModule_abi_cxx11_(&local_50,(ruby *)component._M_string_length,name);
      std::__cxx11::string::operator=((string *)&component,(string *)&local_50);
      std::__cxx11::string::~string((string *)&local_50);
    }
    text._M_str = "module $name$\n";
    text._M_len = 0xe;
    io::Printer::Print<char[5],std::__cxx11::string>(printer,text,(char (*) [5])0x651c1c,&component)
    ;
    printer->indent_ = printer->indent_ + (printer->options_).spaces_per_indent;
    iVar4 = iVar4 + 1;
    std::__cxx11::string::~string((string *)&component);
  }
  std::__cxx11::string::~string((string *)&delimiter);
  std::__cxx11::string::~string((string *)&package_name);
  return iVar4;
}

Assistant:

int GeneratePackageModules(const FileDescriptor* file, io::Printer* printer) {
  int levels = 0;
  bool need_change_to_module = true;
  std::string package_name;

  // Determine the name to use in either format:
  //   proto package:         one.two.three
  //   option ruby_package:   One::Two::Three
  if (file->options().has_ruby_package()) {
    package_name = file->options().ruby_package();

    // If :: is in the package use the Ruby formatted name as-is
    //    -> A::B::C
    // otherwise, use the dot separator
    //    -> A.B.C
    if (absl::StrContains(package_name, "::")) {
      need_change_to_module = false;
    } else if (absl::StrContains(package_name, '.')) {
      ABSL_LOG(WARNING) << "ruby_package option should be in the form of:"
                        << " 'A::B::C' and not 'A.B.C'";
    }
  } else {
    package_name = std::string(file->package());
  }

  // Use the appropriate delimiter
  std::string delimiter = need_change_to_module ? "." : "::";
  size_t delimiter_size = need_change_to_module ? 1 : 2;

  // Extract each module name and indent
  while (!package_name.empty()) {
    size_t dot_index = package_name.find(delimiter);
    std::string component;
    if (dot_index == std::string::npos) {
      component = package_name;
      package_name = "";
    } else {
      component = package_name.substr(0, dot_index);
      package_name = package_name.substr(dot_index + delimiter_size);
    }
    if (need_change_to_module) {
      component = PackageToModule(component);
    }
    printer->Print("module $name$\n", "name", component);
    printer->Indent();
    levels++;
  }
  return levels;
}